

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_time.cpp
# Opt level: O3

Am_Time __thiscall Am_Time::operator-(Am_Time *this,Am_Time *other)

{
  Am_Time_Data *pAVar1;
  long lVar2;
  long *in_RDX;
  
  Am_Time(this);
  lVar2 = ((other->data->time).tv_usec - *(long *)(*in_RDX + 0x18)) + 1000000;
  pAVar1 = this->data;
  (pAVar1->time).tv_sec = ~*(ulong *)(*in_RDX + 0x10) + (other->data->time).tv_sec + lVar2 / 1000000
  ;
  (pAVar1->time).tv_usec = lVar2 % 1000000;
  return (Am_Time)(Am_Time_Data *)this;
}

Assistant:

Am_Time
Am_Time::operator-(const Am_Time &other) const
{
  Am_Time rt;
  long total_usec = 1000000 + data->time.tv_usec - other.data->time.tv_usec;
  rt.data->time.tv_sec = (data->time.tv_sec) - (other.data->time.tv_sec) - 1 +
                         (total_usec / 1000000); // borrow
  rt.data->time.tv_usec = (total_usec % 1000000);
  return rt;
}